

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

IterateResult __thiscall glcts::BlendTestCaseGroup::BlendTest::iterate(BlendTest *this)

{
  byte bVar1;
  ContextInfo *pCVar2;
  RenderContext *renderCtx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  char *layoutQualifier;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar13;
  ostream *poVar14;
  TestError *this_00;
  uint uVar15;
  char cVar16;
  GLSLVersion glslVersion;
  int iVar17;
  int iVar18;
  int iVar19;
  byte bVar20;
  uint uVar21;
  BlendTest *pBVar22;
  char cVar23;
  char cVar24;
  uint uVar25;
  char *in_R8;
  char cVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int *piVar32;
  int iVar33;
  uint uVar34;
  RGBA RVar35;
  char *pcVar36;
  uint uVar37;
  long lVar38;
  Vec4 srcCol;
  Vec4 dstCol;
  VertexArrayBinding posBinding;
  string frgSrc;
  Vec4 refCol;
  ProgramSources sources;
  ShaderProgram p;
  uint local_3a4;
  RGBA local_37c;
  undefined1 local_378 [8];
  undefined8 uStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  BlendTest *local_350;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  int *local_320;
  void *local_318;
  int local_310;
  RGBA local_30c;
  pointer local_308;
  undefined1 local_300 [8];
  _Alloc_hider local_2f8;
  undefined1 local_2f0 [24];
  int local_2d8;
  VertexArrayPointer local_2d0;
  string local_2b0;
  allocator<char> local_290 [16];
  undefined1 local_280 [8];
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [3];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var_00,iVar7);
  local_308 = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_280 = (undefined1  [8])0x1bc3b9e;
  pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
  _Var12 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                     ((pCVar2->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pCVar2->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var12._M_current ==
      (pCVar2->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  else {
    if (this->m_useAllQualifier == false) {
      pcVar36 = GetLayoutQualifierStr(this->m_mode);
    }
    else {
      pcVar36 = "blend_support_all_equations";
    }
    layoutQualifier = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&local_2b0,(glcts *)pcVar36,layoutQualifier,
               "#extension GL_KHR_blend_equation_advanced : require",in_R8);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    GetDef2DVtxSrc_abi_cxx11_((string *)local_378,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_300,(char *)local_378,local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_348,local_2b0._M_dataplus._M_p,(allocator<char> *)&local_37c);
    local_1d0[0x10] = 0;
    local_1d0._17_8_ = 0;
    local_1d0._0_8_ = (pointer)0x0;
    local_1d0[8] = 0;
    local_1d0._9_7_ = 0;
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_280,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_280,(value_type *)local_300);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_268,(value_type *)local_348);
    glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_1f0);
    lVar38 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_280 + lVar38));
      lVar38 = lVar38 + -0x18;
    } while (lVar38 != -0x18);
    if (local_348 != (undefined1  [8])&local_338) {
      operator_delete((void *)local_348,local_338._M_allocated_capacity + 1);
    }
    if ((undefined1 *)CONCAT44(local_300._4_4_,local_300._0_4_) != local_2f0) {
      operator_delete((undefined1 *)CONCAT44(local_300._4_4_,local_300._0_4_),local_2f0._0_8_ + 1);
    }
    if (local_378 != (undefined1  [8])&local_368) {
      operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
    }
    if (local_100.m_program.m_info.linkOk == false) {
      glu::operator<<((TestLog *)local_308,&local_100);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x3ae);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar13 + 0x1680))(local_100.m_program.m_program);
    dVar8 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar8,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3b1);
    local_378 = (undefined1  [8])&local_368;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"aPos","");
    local_280._0_4_ = 1;
    local_278._0_8_ = local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_378,(char *)((long)local_378 + uStack_370));
    local_268[0].field_2._M_allocated_capacity._0_4_ = 0;
    local_300._0_4_ = local_280._0_4_;
    local_2f8._M_p = local_2f0 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8,local_278._0_8_,
               (undefined1 *)
               ((long)&((_Alloc_hider *)local_278._8_8_)->_M_p +
               (long)&((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_278._0_8_)->_M_impl));
    local_2d8 = (undefined4)local_268[0].field_2._M_allocated_capacity;
    local_2d0.componentType = VTX_COMP_FLOAT;
    local_2d0.convert = VTX_COMP_CONVERT_NONE;
    local_2d0.numComponents = 2;
    local_2d0.numElements = 4;
    local_2d0.stride = 0;
    local_2d0.data = s_pos;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_ !=
        local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0]._M_dataplus._M_p + 1));
    }
    if (local_378 != (undefined1  [8])&local_368) {
      operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
    }
    (**(code **)(lVar13 + 0x4e8))(0xbd0);
    (**(code **)(lVar13 + 0x5e0))(0xc11);
    (**(code **)(lVar13 + 0x5e0))(0xbe2);
    (**(code **)(lVar13 + 0x100))(this->m_mode);
    dVar8 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar8,"BlendEquation failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3ba);
    local_280 = (undefined1  [8])0x1bc3bbd;
    pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
    local_320 = (int *)CONCAT44(extraout_var,iVar6);
    _Var12 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                       ((pCVar2->m_extensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pCVar2->m_extensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    local_350 = this;
    if (0 < this->m_numColors) {
      pbVar3 = (pCVar2->m_extensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar6 = 0;
      do {
        pBVar22 = local_350;
        local_378 = (undefined1  [8])0x0;
        uStack_370 = 0;
        local_348 = (undefined1  [8])0x0;
        uStack_340 = 0;
        getTestColors(local_350,iVar6,(Vec4 *)local_378,(Vec4 *)local_348);
        iVar7 = (*((pBVar22->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
        (**(code **)(lVar13 + 0x1290))
                  ((long)iVar6 % (long)*(int *)CONCAT44(extraout_var_01,iVar7) & 0xffffffff,
                   (long)iVar6 / (long)*(int *)CONCAT44(extraout_var_01,iVar7) & 0xffffffff,1,1);
        (**(code **)(lVar13 + 0x1c0))
                  (local_348._0_4_,local_348._4_4_,(float)uStack_340,uStack_340._4_4_);
        (**(code **)(lVar13 + 0x188))(0x4000);
        if (_Var12._M_current == pbVar3) {
          (**(code **)(lVar13 + 0xf0))();
        }
        pcVar4 = *(code **)(lVar13 + 0x15a0);
        uVar9 = (**(code **)(lVar13 + 0xb48))(local_100.m_program.m_program,"uSrcCol");
        (*pcVar4)(local_378._0_4_,local_378._4_4_,(float)uStack_370,uStack_370._4_4_,uVar9);
        dVar8 = (**(code **)(lVar13 + 0x800))();
        glu::checkError(dVar8,"Uniforms failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x3d1);
        local_280 = (undefined1  [8])0x600000000;
        local_278._0_4_ = 1;
        local_278._8_8_ = s_indices;
        glu::draw(((local_350->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program
                  ,1,(VertexArrayBinding *)local_300,(PrimitiveList *)local_280,
                  (DrawUtilCallback *)0x0);
        dVar8 = (**(code **)(lVar13 + 0x800))();
        glu::checkError(dVar8,"Draw failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x3d6);
        if (_Var12._M_current == pbVar3) {
          (**(code **)(lVar13 + 0xf0))();
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < local_350->m_numColors);
    }
    iVar6 = *local_320;
    iVar7 = local_320[1];
    local_318 = operator_new__((long)(iVar6 * iVar7 * 4));
    (**(code **)(lVar13 + 0xff0))(0xd05,1);
    (**(code **)(lVar13 + 0x1220))(0,0,iVar6,iVar7,0x1908,0x1401,local_318);
    dVar8 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar8,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3e1);
    pBVar22 = local_350;
    if (local_350->m_numColors < 1) {
      bVar20 = 1;
    }
    else {
      bVar20 = 1;
      iVar7 = 0;
      piVar32 = local_320;
      do {
        local_378 = (undefined1  [8])0x0;
        uStack_370 = 0;
        local_348 = (undefined1  [8])0x0;
        uStack_340 = 0;
        getTestColors(pBVar22,iVar7,(Vec4 *)local_378,(Vec4 *)local_348);
        iVar10 = (*((pBVar22->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar33 = iVar7 / *(int *)CONCAT44(extraout_var_02,iVar10);
        iVar10 = iVar7 % *(int *)CONCAT44(extraout_var_02,iVar10);
        Blend((glcts *)local_290,pBVar22->m_mode,(Vec4 *)local_378,(Vec4 *)local_348);
        tcu::RGBA::RGBA((RGBA *)local_280,(Vec4 *)local_290);
        cVar16 = (char)piVar32[2];
        if (piVar32[2] == 1) {
          local_3a4 = (uint)(int)local_280[0] >> 7 & 0xff;
        }
        else {
          uVar27 = (local_280._0_4_ & 0xff) >> (8U - cVar16 & 0x1f);
          local_3a4 = uVar27 >> (cVar16 * '\x02' - 8U & 0x1f) | uVar27 << (8U - cVar16 & 0x1f);
        }
        cVar23 = (char)piVar32[3];
        if (piVar32[3] == 1) {
          uVar27 = (uint)(int)local_280._0_2_ >> 0xf & 0xff;
        }
        else {
          uVar27 = ((uint)local_280._0_4_ >> 8 & 0xff) >> (8U - cVar23 & 0x1f);
          uVar27 = uVar27 >> (cVar23 * '\x02' - 8U & 0x1f) | uVar27 << (8U - cVar23 & 0x1f);
        }
        cVar24 = (char)piVar32[4];
        if (piVar32[4] == 1) {
          uVar30 = (int)(local_280._0_4_ << 8) >> 0x1f & 0xff;
        }
        else {
          uVar30 = ((uint)local_280._0_4_ >> 0x10 & 0xff) >> (8U - cVar24 & 0x1f);
          uVar30 = uVar30 >> (cVar24 * '\x02' - 8U & 0x1f) | uVar30 << (8U - cVar24 & 0x1f);
        }
        iVar17 = piVar32[5];
        cVar26 = (char)iVar17;
        if (iVar17 == 0) {
          uVar11 = 0xff;
        }
        else if (iVar17 == 1) {
          uVar11 = (int)local_280._0_4_ >> 0x1f & 0xff;
        }
        else {
          uVar11 = ((uint)local_280._0_4_ >> 0x18) >> (8U - cVar26 & 0x1f);
          uVar11 = uVar11 >> (cVar26 * '\x02' - 8U & 0x1f) | uVar11 << (8U - cVar26 & 0x1f);
        }
        uVar28 = uVar27 << 8 | local_3a4;
        uVar31 = uVar30 << 0x10 | uVar11 << 0x18 | uVar28;
        lVar13 = (long)((iVar33 * iVar6 + iVar10) * 4);
        bVar1 = *(byte *)((long)local_318 + lVar13 + 2);
        uVar29 = (uint)*(byte *)((long)local_318 + lVar13 + 1);
        uVar25 = (uint)bVar1;
        uVar30 = (uint)*(byte *)((long)local_318 + lVar13 + 3);
        uVar11 = (uint)*(byte *)((long)local_318 + lVar13);
        uVar27 = 0x1000000 << (8U - cVar26 & 0x1f);
        if (iVar17 < 1) {
          uVar27 = 0;
        }
        uVar21 = 0x100 << (8U - cVar23 & 0x1f) | 1 << ((byte)(8U - cVar16) & 0x1f);
        uVar27 = 0x10000 << (8U - cVar24 & 0x1f) | uVar21 | uVar27;
        uVar34 = 2 << (8U - cVar16 & 0x1f) & 0x1fe;
        if (0xfc < uVar34) {
          uVar34 = 0xfd;
        }
        uVar21 = uVar21 >> 7 & 0x1fe;
        if (0xfc < uVar21) {
          uVar21 = 0xfd;
        }
        uVar37 = uVar27 >> 0xf & 0x1fe;
        if (0xfc < uVar37) {
          uVar37 = 0xfd;
        }
        uVar27 = uVar27 >> 0x17 & 0xfffffffe;
        if (0xfc < uVar27) {
          uVar27 = 0xfd;
        }
        uVar37 = uVar37 * 0x10000 + 0x20000 | uVar27 * 0x1000000 + 0x2000000;
        uVar27 = uVar21 * 0x100 + 0x200 | uVar34 + 2;
        RVar35.m_value = uVar37 | uVar27;
        bVar5 = true;
        local_310 = iVar33;
        if (uVar31 != ((uint)bVar1 << 0x10 | uVar29 << 8 | uVar30 << 0x18 | uVar11)) {
          uVar15 = (local_3a4 & 0xff) - uVar11;
          uVar21 = -uVar15;
          if (0 < (int)uVar15) {
            uVar21 = uVar15;
          }
          iVar17 = (uVar28 >> 8 & 0xff) - uVar29;
          iVar33 = -iVar17;
          if (0 < iVar17) {
            iVar33 = iVar17;
          }
          iVar18 = (uVar31 >> 0x10 & 0xff) - uVar25;
          iVar17 = -iVar18;
          if (0 < iVar18) {
            iVar17 = iVar18;
          }
          iVar19 = (uVar31 >> 0x18) - uVar30;
          iVar18 = -iVar19;
          if (0 < iVar19) {
            iVar18 = iVar19;
          }
          local_280._0_4_ = iVar17 << 0x10 | iVar18 << 0x18 | iVar33 << 8 | uVar21;
          bVar5 = tcu::RGBA::isBelowThreshold((RGBA *)local_280,RVar35);
        }
        if (bVar5 == false) {
          local_280 = (undefined1  [8])local_308;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"(",1);
          std::ostream::operator<<((ostringstream *)local_278,iVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,",",1);
          std::ostream::operator<<((ostringstream *)local_278,local_310);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,")  ",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"(",1);
          std::ostream::operator<<((ostringstream *)local_278,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Exceeds: ",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
          poVar14 = (ostream *)
                    std::ostream::operator<<((ostringstream *)local_278,uVar34 + 2 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar27 >> 8 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar35.m_value >> 0x10 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar37 >> 0x18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," diff:",6);
          uVar21 = (local_3a4 & 0xff) - uVar11;
          uVar27 = -uVar21;
          if (0 < (int)uVar21) {
            uVar27 = uVar21;
          }
          uVar28 = uVar28 >> 8 & 0xff;
          iVar33 = uVar28 - uVar29;
          iVar10 = -iVar33;
          if (0 < iVar33) {
            iVar10 = iVar33;
          }
          uVar21 = uVar31 >> 0x10 & 0xff;
          iVar17 = uVar21 - uVar25;
          iVar33 = -iVar17;
          if (0 < iVar17) {
            iVar33 = iVar17;
          }
          iVar18 = (uVar31 >> 0x18) - uVar30;
          iVar17 = -iVar18;
          if (0 < iVar18) {
            iVar17 = iVar18;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
          poVar14 = (ostream *)std::ostream::operator<<(local_278,uVar27 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          uVar27 = iVar17 << 0x18 | uVar27 | iVar33 << 0x10 | iVar10 << 8;
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar27 >> 8 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar27 >> 0x10 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar27 >> 0x18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  res:",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
          poVar14 = (ostream *)std::ostream::operator<<(local_278,uVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar29);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar30);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  ref:",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
          poVar14 = (ostream *)std::ostream::operator<<(local_278,local_3a4 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar28);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar21);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar31 >> 0x18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  dst:",6);
          tcu::RGBA::RGBA(&local_37c,(Vec4 *)local_348);
          piVar32 = local_320;
          pBVar22 = local_350;
          RVar35.m_value = local_37c.m_value;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
          poVar14 = (ostream *)std::ostream::operator<<(local_278,RVar35.m_value & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar35.m_value >> 8 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar35.m_value >> 0x10 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar35.m_value >> 0x18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  src:",6);
          tcu::RGBA::RGBA(&local_30c,(Vec4 *)local_378);
          RVar35.m_value = local_30c.m_value;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
          poVar14 = (ostream *)std::ostream::operator<<(local_278,RVar35.m_value & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar35.m_value >> 8 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar35.m_value >> 0x10 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar35.m_value >> 0x18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
          std::ios_base::~ios_base(local_208);
        }
        bVar20 = bVar20 & bVar5;
        iVar7 = iVar7 + 1;
      } while (iVar7 < pBVar22->m_numColors);
    }
    pcVar36 = "Fail (results differ)";
    if (bVar20 != 0) {
      pcVar36 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pBVar22->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar20 ^ 1),
               pcVar36);
    operator_delete__(local_318);
    if (local_2f8._M_p != local_2f0 + 8) {
      operator_delete(local_2f8._M_p,local_2f0._8_8_ + 1);
    }
    glu::ShaderProgram::~ShaderProgram(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  return STOP;
}

Assistant:

BlendTestCaseGroup::BlendTest::IterateResult BlendTestCaseGroup::BlendTest::iterate(void)
{
	const tcu::RenderTarget& rt  = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf  = rt.getPixelFormat();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	TestLog&				 log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	// Setup program.
	std::string frgSrc =
		GetSolidShader(m_useAllQualifier ? "blend_support_all_equations" : GetLayoutQualifierStr(m_mode),
					   glu::getGLSLVersionDeclaration(m_glslVersion));
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_SCISSOR_TEST);
	gl.enable(GL_BLEND);
	gl.blendEquation(m_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	bool needBarrier = !IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced_coherent");

	// Render loop.
	for (int colorIndex = 0; colorIndex < m_numColors; colorIndex++)
	{
		tcu::Vec4 srcCol, dstCol;
		getTestColors(colorIndex, srcCol, dstCol);

		// Get pixel to blend.
		int x, y;
		getCoordinates(colorIndex, x, y);
		gl.scissor(x, y, 1, 1);

		// Clear to destination color.
		gl.clearColor(dstCol[0], dstCol[1], dstCol[2], dstCol[3]);
		gl.clear(GL_COLOR_BUFFER_BIT);
		if (needBarrier)
			gl.blendBarrier();

		// Set source color.
		gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol[0], srcCol[1], srcCol[2], srcCol[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

		// Draw.
		glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
		if (needBarrier)
			gl.blendBarrier();
	}

	// Read the results.
	const int	 w			  = rt.getWidth();
	const int	 h			  = rt.getHeight();
	glw::GLubyte* resultBytes = new glw::GLubyte[4 * w * h];
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.readPixels(0, 0, w, h, GL_RGBA, GL_UNSIGNED_BYTE, resultBytes);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	bool pass = true;
	for (int colorIndex = 0; colorIndex < m_numColors; colorIndex++)
	{
		tcu::Vec4 srcCol, dstCol;
		getTestColors(colorIndex, srcCol, dstCol);

		// Get result and calculate reference.
		int x, y;
		getCoordinates(colorIndex, x, y);

		tcu::Vec4 refCol	= Blend(m_mode, srcCol, dstCol);
		tcu::RGBA ref		= pf.convertColor(tcu::RGBA(refCol));
		tcu::RGBA res		= tcu::RGBA::fromBytes(resultBytes + 4 * (x + w * y));
		tcu::RGBA tmp		= pf.getColorThreshold();
		tcu::RGBA threshold = tcu::RGBA(std::min(2 + 2 * tmp.getRed(), 255), std::min(2 + 2 * tmp.getGreen(), 255),
										std::min(2 + 2 * tmp.getBlue(), 255), std::min(2 + 2 * tmp.getAlpha(), 255));
		bool pixelOk = tcu::compareThreshold(ref, res, threshold);
		pass		 = pass && pixelOk;
		if (!pixelOk)
		{
			log << TestLog::Message << "(" << x << "," << y << ")  "
				<< "(" << colorIndex << ") "
				<< "Exceeds: " << threshold << " diff:" << tcu::computeAbsDiff(ref, res) << "  res:" << res
				<< "  ref:" << ref << "  dst:" << tcu::RGBA(dstCol) << "  src:" << tcu::RGBA(srcCol)
				<< TestLog::EndMessage;
		}
	}

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail (results differ)");
	delete[] resultBytes;
	return STOP;
}